

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

SwapchainBuilder * __thiscall
vkb::SwapchainBuilder::add_fallback_present_mode
          (SwapchainBuilder *this,VkPresentModeKHR present_mode)

{
  VkPresentModeKHR local_14;
  SwapchainBuilder *pSStack_10;
  VkPresentModeKHR present_mode_local;
  SwapchainBuilder *this_local;
  
  local_14 = present_mode;
  pSStack_10 = this;
  std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::push_back
            (&(this->info).desired_present_modes,&local_14);
  return this;
}

Assistant:

SwapchainBuilder& SwapchainBuilder::add_fallback_present_mode(VkPresentModeKHR present_mode) {
    info.desired_present_modes.push_back(present_mode);
    return *this;
}